

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bsreadlns(bstring r,bStream *s,bstring term)

{
  int iVar1;
  
  if ((((s != (bStream *)0x0) && (term != (bstring)0x0)) && (r != (bstring)0x0)) &&
     (((s->buff != (bstring)0x0 && (term->data != (uchar *)0x0)) && (0 < r->mlen)))) {
    if (term->slen == 1) {
      iVar1 = bsreadln(r,s,*term->data);
      return iVar1;
    }
    if (0 < term->slen) {
      iVar1 = balloc(s->buff,s->maxBuffSz + 1);
      if (iVar1 == 0) {
        r->slen = 0;
        iVar1 = bsreadlnsa(r,s,term);
        return iVar1;
      }
    }
  }
  return -1;
}

Assistant:

int bsreadlns (bstring r, struct bStream * s, const bstring term) {
	if (s == NULL || s->buff == NULL || r == NULL || term == NULL 
	 || term->data == NULL || r->mlen <= 0) return BSTR_ERR;
	if (term->slen == 1) return bsreadln (r, s, term->data[0]);
	if (term->slen < 1) return BSTR_ERR;
	if (BSTR_OK != balloc (s->buff, s->maxBuffSz + 1)) return BSTR_ERR;
	r->slen = 0;
	return bsreadlnsa (r, s, term);
}